

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::StringMaker<wchar_t_const*,void>::convert_abi_cxx11_(wchar_t *str)

{
  long in_RSI;
  string *in_RDI;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_ffffffffffffff88;
  allocator<char> local_45 [5];
  allocator<wchar_t> *in_stack_ffffffffffffffc0;
  wchar_t *in_stack_ffffffffffffffc8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_ffffffffffffffd0;
  
  if (in_RSI == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,
               (allocator<char> *)in_stack_ffffffffffffffc0);
    std::allocator<char>::~allocator(local_45);
  }
  else {
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    Detail::stringify<std::__cxx11::wstring>(in_stack_ffffffffffffff88);
    std::__cxx11::wstring::~wstring((wstring *)&stack0xffffffffffffffd0);
    std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&stack0xffffffffffffffcf);
  }
  return in_RDI;
}

Assistant:

std::string StringMaker<wchar_t const*>::convert(wchar_t const * str) {
    if (str) {
        return ::Catch::Detail::stringify(std::wstring{ str });
    } else {
        return{ "{null string}" };
    }
}